

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonIterativeFeaturePreservingMeshFiltering.cpp
# Opt level: O2

void __thiscall
NonIterativeFeaturePreservingMeshFiltering::denoise
          (NonIterativeFeaturePreservingMeshFiltering *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ParameterSet *pPVar5;
  double dVar6;
  double sigma_f;
  bool bVar7;
  Point *pPVar8;
  long lVar9;
  reference pvVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  VertexIter VVar19;
  undefined1 local_370 [8];
  TriMesh mesh;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  mollified_normals;
  double sigma_g_mean_edge_length_ratio;
  double sigma_f_mean_edge_length_ratio;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> new_point;
  undefined1 local_f8 [8];
  VertexIter v_it_1;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> face_centroid
  ;
  undefined1 auStack_98 [8];
  vector<double,_std::allocator<double>_> face_area;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  undefined1 auStack_58 [8];
  VertexIter v_it;
  
  OpenMesh::TriMesh_ArrayKernelT<MyTraits>::TriMesh_ArrayKernelT
            ((TriMesh_ArrayKernelT<MyTraits> *)local_370,
             &((this->super_MeshDenoisingBase).data_manager_)->noisy_mesh_);
  if (mesh.super_Mesh.
      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
      _168_8_ !=
      mesh.super_Mesh.
      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
      _160_8_) {
    pPVar5 = (this->super_MeshDenoisingBase).parameter_set_;
    std::__cxx11::string::string
              ((string *)auStack_98,"sigma_f/mean_edge_length",(allocator *)&v_it_1.hnd_);
    bVar7 = ParameterSet::getValue(pPVar5,(string *)auStack_98,&sigma_g_mean_edge_length_ratio);
    std::__cxx11::string::~string((string *)auStack_98);
    if (bVar7) {
      pPVar5 = (this->super_MeshDenoisingBase).parameter_set_;
      std::__cxx11::string::string
                ((string *)auStack_98,"sigma_g/mean_edge_length",(allocator *)&v_it_1.hnd_);
      bVar7 = ParameterSet::getValue
                        (pPVar5,(string *)auStack_98,
                         (double *)
                         &mollified_normals.
                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)auStack_98);
      if (bVar7) {
        dVar6 = MeshDenoisingBase::getAverageEdgeLength
                          (&this->super_MeshDenoisingBase,(TriMesh *)local_370);
        auStack_98 = (undefined1  [8])0x0;
        face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        MeshDenoisingBase::getFaceArea
                  (&this->super_MeshDenoisingBase,(TriMesh *)local_370,
                   (vector<double,_std::allocator<double>_> *)auStack_98);
        v_it_1.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
        v_it_1.skip_bits_ = 0;
        MeshDenoisingBase::getFaceCentroid
                  (&this->super_MeshDenoisingBase,(TriMesh *)local_370,
                   (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    *)&v_it_1.hnd_);
        sigma_f = sigma_g_mean_edge_length_ratio * dVar6;
        mesh.super_Mesh.
        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
        .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
        refcount_fcolors_ = 0;
        mesh.super_Mesh.
        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
        .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
        refcount_ftextureIndex_ = 0;
        mollified_normals.
        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        mollified_normals.
        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        mollifiedNormals(this,(TriMesh *)local_370,
                         (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)&v_it_1.hnd_,(vector<double,_std::allocator<double>_> *)auStack_98,
                         sigma_f,(vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  *)&mesh.super_Mesh.
                                     super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                     .
                                     super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                     .refcount_fcolors_);
        std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
        vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                *)&sigma_f_mean_edge_length_ratio,
               (long)(mesh.super_Mesh.
                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                      .
                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      ._168_8_ -
                     mesh.super_Mesh.
                     super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                     .
                     super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     ._160_8_) >> 2,(allocator_type *)auStack_58);
        _auStack_58 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)local_370);
        while( true ) {
          VVar19 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)local_370);
          if ((BaseHandle)v_it.mesh_._0_4_ == VVar19.hnd_.super_BaseHandle.idx_.super_BaseHandle &&
              auStack_58 == (undefined1  [8])VVar19.mesh_) break;
          pPVar8 = OpenMesh::
                   AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                   ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                            *)local_370,(VertexHandle)v_it.mesh_._0_4_);
          *(double *)((long)sigma_f_mean_edge_length_ratio + 0x10 + (long)v_it.mesh_._0_4_ * 0x18) =
               (pPVar8->super_VectorDataT<double,_3>).values_[2];
          dVar2 = (pPVar8->super_VectorDataT<double,_3>).values_[1];
          pdVar1 = (double *)((long)sigma_f_mean_edge_length_ratio + (long)v_it.mesh_._0_4_ * 0x18);
          *pdVar1 = (pPVar8->super_VectorDataT<double,_3>).values_[0];
          pdVar1[1] = dVar2;
          OpenMesh::Iterators::
          GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
          ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                        *)auStack_58,0);
        }
        _local_f8 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)local_370);
        while( true ) {
          VVar19 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)local_370);
          if ((BaseHandle)v_it_1.mesh_._0_4_ == VVar19.hnd_.super_BaseHandle.idx_.super_BaseHandle
              && local_f8 == (undefined1  [8])VVar19.mesh_) break;
          pPVar8 = OpenMesh::
                   AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                   ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                            *)local_370,(VertexHandle)v_it_1.mesh_._0_4_);
          dVar2 = (pPVar8->super_VectorDataT<double,_3>).values_[0];
          dVar3 = (pPVar8->super_VectorDataT<double,_3>).values_[1];
          dVar4 = (pPVar8->super_VectorDataT<double,_3>).values_[2];
          _auStack_58 = (VertexIter)ZEXT816(0);
          v_it.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
          v_it.skip_bits_ = 0;
          getVertexFaceNeighbor
                    (this,(TriMesh *)local_370,
                     (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      *)&v_it_1.hnd_,(VertexHandle)v_it_1.mesh_._0_4_,sigma_f,
                     (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                     auStack_58);
          local_78 = 0.0;
          local_70 = 0.0;
          local_68 = 0.0;
          local_60 = 0.0;
          for (lVar11 = 0; lVar11 < (int)((ulong)((long)v_it.mesh_ - (long)auStack_58) >> 2);
              lVar11 = lVar11 + 1) {
            lVar9 = (long)*(int *)((long)&(((mesh_ptr)auStack_58)->super_ArrayKernel).
                                          super_BaseKernel._vptr_BaseKernel + lVar11 * 4) * 0x18;
            dVar13 = *(double *)(v_it_1._8_8_ + 8 + lVar9);
            dVar12 = *(double *)(v_it_1._8_8_ + 0x10 + lVar9);
            dVar14 = *(double *)
                      (mesh.super_Mesh.
                       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                       .
                       super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       ._544_8_ + 8 + lVar9);
            dVar16 = *(double *)
                      (mesh.super_Mesh.
                       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                       .
                       super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       ._544_8_ + 0x10 + lVar9);
            dVar18 = (dVar4 - dVar12) * dVar16 +
                     (dVar3 - dVar13) * dVar14 +
                     (dVar2 - *(double *)(v_it_1._8_8_ + lVar9)) *
                     *(double *)
                      (mesh.super_Mesh.
                       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                       .
                       super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       ._544_8_ + lVar9) + 0.0;
            dVar17 = dVar2 - *(double *)
                              (mesh.super_Mesh.
                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                               .
                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                               ._544_8_ + lVar9) * dVar18;
            dVar15 = dVar3 - dVar14 * dVar18;
            dVar16 = dVar4 - dVar18 * dVar16;
            dVar14 = *(double *)(v_it_1._8_8_ + lVar9) - dVar2;
            dVar13 = dVar13 - dVar3;
            dVar12 = dVar12 - dVar4;
            dVar13 = SQRT(dVar12 * dVar12 + dVar14 * dVar14 + dVar13 * dVar13);
            new_point.
            super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)exp((dVar13 * -0.5 * dVar13) / (sigma_f * sigma_f));
            dVar13 = dVar17 - dVar2;
            dVar12 = dVar15 - dVar3;
            dVar14 = dVar16 - dVar4;
            dVar13 = SQRT(dVar14 * dVar14 + dVar13 * dVar13 + dVar12 * dVar12);
            dVar12 = exp((dVar13 * -0.5 * dVar13) /
                         (dVar6 * (double)mollified_normals.
                                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage *
                         dVar6 * (double)mollified_normals.
                                         super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage));
            dVar13 = *(double *)
                      ((long)auStack_98 +
                      (long)*(int *)((long)&(((ArrayKernel *)auStack_58)->super_BaseKernel).
                                            _vptr_BaseKernel + lVar11 * 4) * 8);
            local_70 = local_70 +
                       dVar17 * dVar13 *
                       (double)new_point.
                               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage * dVar12;
            local_68 = local_68 +
                       dVar15 * dVar13 *
                       (double)new_point.
                               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage * dVar12;
            local_60 = local_60 +
                       dVar16 * dVar13 *
                       (double)new_point.
                               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage * dVar12;
            local_78 = local_78 +
                       (double)new_point.
                               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage * dVar13 * dVar12;
          }
          pvVar10 = std::
                    vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    ::at((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)&sigma_f_mean_edge_length_ratio,(long)v_it_1.mesh_._0_4_);
          (pvVar10->super_VectorDataT<double,_3>).values_[0] = local_70 / local_78;
          (pvVar10->super_VectorDataT<double,_3>).values_[1] = local_68 / local_78;
          (pvVar10->super_VectorDataT<double,_3>).values_[2] = local_60 / local_78;
          std::_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
          ~_Vector_base((_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *
                        )auStack_58);
          OpenMesh::Iterators::
          GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
          ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                        *)local_f8,0);
        }
        _auStack_58 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)local_370);
        while( true ) {
          VVar19 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)local_370);
          if ((BaseHandle)v_it.mesh_._0_4_ == VVar19.hnd_.super_BaseHandle.idx_.super_BaseHandle &&
              auStack_58 == (undefined1  [8])VVar19.mesh_) break;
          OpenMesh::
          AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
          set_point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     *)local_370,(VertexHandle)v_it.mesh_._0_4_,
                    (Point *)((long)v_it.mesh_._0_4_ * 0x18 + (long)sigma_f_mean_edge_length_ratio))
          ;
          OpenMesh::Iterators::
          GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
          ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                        *)auStack_58,0);
        }
        OpenMesh::
        AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
        operator=((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                   *)&((this->super_MeshDenoisingBase).data_manager_)->mesh_,
                  (AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                   *)local_370);
        OpenMesh::
        AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
        operator=((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                   *)&((this->super_MeshDenoisingBase).data_manager_)->denoised_mesh_,
                  (AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                   *)local_370);
        std::
        _Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
        ~_Vector_base((_Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                       *)&sigma_f_mean_edge_length_ratio);
        std::
        _Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
        ~_Vector_base((_Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                       *)&mesh.super_Mesh.
                          super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                          .
                          super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                          .refcount_fcolors_);
        std::
        _Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
        ~_Vector_base((_Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                       *)&v_it_1.hnd_);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)auStack_98);
      }
    }
  }
  OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_370);
  return;
}

Assistant:

void NonIterativeFeaturePreservingMeshFiltering::denoise()
{
    // get data
    TriMesh mesh = data_manager_->getNoisyMesh();

    if(mesh.n_vertices() == 0)
        return;

    // get parameter
    double sigma_g_mean_edge_length_ratio, sigma_f_mean_edge_length_ratio;
    if(!parameter_set_->getValue(string("sigma_f/mean_edge_length"), sigma_f_mean_edge_length_ratio))
        return;
    if(!parameter_set_->getValue(string("sigma_g/mean_edge_length"), sigma_g_mean_edge_length_ratio))
        return;

    // mesh denoise
    double mean_edge_length = getAverageEdgeLength(mesh);
    std::vector<double> face_area;
    getFaceArea(mesh, face_area);
    std::vector<TriMesh::Point> face_centroid;
    getFaceCentroid(mesh, face_centroid);

    double sigma_f = sigma_f_mean_edge_length_ratio * mean_edge_length;
    double sigma_g = sigma_g_mean_edge_length_ratio * mean_edge_length;

    std::vector<TriMesh::Normal> mollified_normals;
    mollifiedNormals(mesh, face_centroid, face_area, sigma_f, mollified_normals);

    std::vector<TriMesh::Point> new_point(mesh.n_vertices());
    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
        new_point[v_it->idx()] = mesh.point(*v_it);

    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
    {
        TriMesh::Point pt = mesh.point(*v_it);

        std::vector<TriMesh::FaceHandle> vertex_face_neighbor;
        getVertexFaceNeighbor(mesh, face_centroid, *v_it, sigma_f, vertex_face_neighbor);

        TriMesh::Point temp_point(0.0, 0.0, 0.0);
        double weight_sum = 0.0;

        for(int i = 0; i <(int)vertex_face_neighbor.size(); i++)
        {
            TriMesh::Point centroid = face_centroid[vertex_face_neighbor[i].idx()];
            TriMesh::Normal normal = mollified_normals[vertex_face_neighbor[i].idx()];
            TriMesh::Point projection_point = projectPoint(pt, centroid, normal);

            double distance_spatial = (centroid - pt).length();
            double weight_spatial = std::exp(- 0.5 * distance_spatial * distance_spatial /(sigma_f * sigma_f));

            double distance_influence = (projection_point - pt).length();
            double weight_influence = std::exp(- 0.5 * distance_influence * distance_influence /(sigma_g * sigma_g));

            double area = face_area[vertex_face_neighbor[i].idx()];

            temp_point += projection_point * area * weight_spatial * weight_influence;
            weight_sum += area * weight_spatial * weight_influence;
        }
        temp_point /= weight_sum;

        new_point.at((*v_it).idx()) = temp_point;
    }

    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
        mesh.set_point(*v_it, new_point[(*v_it).idx()]);

    // update data
    data_manager_->setMesh(mesh);
    data_manager_->setDenoisedMesh(mesh);
}